

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v11::detail::format_dragon
               (basic_fp<unsigned___int128> value,uint flags,int num_digits,buffer<char> *buf,
               int *exp10)

{
  undefined1 n [16];
  undefined1 value_00 [16];
  undefined1 n_00 [16];
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  int *in_RCX;
  bigint *in_RDX;
  int in_ESI;
  int iVar8;
  uint in_EDI;
  bool bVar9;
  byte in_stack_00000008;
  int in_stack_00000018;
  int i_1;
  int overflow;
  int result;
  int digit;
  int digit_3;
  int i;
  char digit_2;
  int result_1;
  bool high;
  bool low;
  int digit_1;
  char *data;
  bool shortest;
  int even;
  int shift;
  bool is_predecessor_closer;
  bigint *upper;
  bigint upper_store;
  bigint lower;
  bigint denominator;
  bigint numerator;
  undefined4 in_stack_fffffffffffffc68;
  undefined2 in_stack_fffffffffffffc6c;
  undefined1 in_stack_fffffffffffffc6e;
  undefined1 in_stack_fffffffffffffc6f;
  undefined1 uVar10;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  bigint *in_stack_fffffffffffffc80;
  bigint *divisor;
  undefined2 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8a;
  undefined1 in_stack_fffffffffffffc8b;
  undefined4 in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  int in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined4 in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  int local_344;
  int local_338;
  char local_334;
  int local_330;
  undefined1 *local_2d0;
  undefined1 local_2c8 [168];
  undefined1 local_220 [520];
  int *local_18;
  bigint *local_10;
  int local_8;
  uint local_4;
  
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  bigint::bigint((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  local_2d0 = (undefined1 *)0x0;
  bVar9 = (local_4 & 1) != 0;
  if (in_stack_00000018 < 0) {
    if (*local_18 < 0) {
      bigint::assign_pow10(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                     (bigint *)
                     CONCAT44(in_stack_fffffffffffffc8c,
                              CONCAT13(in_stack_fffffffffffffc8b,
                                       CONCAT12(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)
                                      )));
      if (bVar9) {
        bigint::assign((bigint *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                       (bigint *)
                       CONCAT44(in_stack_fffffffffffffc8c,
                                CONCAT13(in_stack_fffffffffffffc8b,
                                         CONCAT12(in_stack_fffffffffffffc8a,
                                                  in_stack_fffffffffffffc88))));
        bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                            in_stack_fffffffffffffc94);
        local_2d0 = local_2c8;
      }
      value_00._4_4_ = in_stack_fffffffffffffc94;
      value_00._0_4_ = in_stack_fffffffffffffc90;
      value_00._8_4_ = in_stack_fffffffffffffc98;
      value_00._12_4_ = in_stack_fffffffffffffc9c;
      bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                         (unsigned___int128)value_00);
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                          in_stack_fffffffffffffc94);
      bigint::operator=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                        CONCAT13(in_stack_fffffffffffffc6f,
                                 CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                          in_stack_fffffffffffffc94);
    }
    else {
      n_00._4_4_ = in_stack_fffffffffffffc94;
      n_00._0_4_ = in_stack_fffffffffffffc90;
      n_00._8_4_ = in_stack_fffffffffffffc98;
      n_00._12_4_ = in_stack_fffffffffffffc9c;
      bigint::operator=((bigint *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                        (unsigned___int128)n_00);
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                          in_stack_fffffffffffffc94);
      bigint::assign_pow10(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                          in_stack_fffffffffffffc94);
      bigint::operator=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                        CONCAT13(in_stack_fffffffffffffc6f,
                                 CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      if (bVar9) {
        bigint::operator=(in_stack_fffffffffffffc80,
                          CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
        local_2d0 = local_2c8;
      }
    }
  }
  else {
    n._4_4_ = in_stack_fffffffffffffc94;
    n._0_4_ = in_stack_fffffffffffffc90;
    n._8_4_ = in_stack_fffffffffffffc98;
    n._12_4_ = in_stack_fffffffffffffc9c;
    bigint::operator=((bigint *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                      (unsigned___int128)n);
    bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                        in_stack_fffffffffffffc94);
    bigint::operator=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                      CONCAT13(in_stack_fffffffffffffc6f,
                               CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
    bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                        in_stack_fffffffffffffc94);
    if (bVar9) {
      bigint::operator=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                        CONCAT13(in_stack_fffffffffffffc6f,
                                 CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                          in_stack_fffffffffffffc94);
      local_2d0 = local_2c8;
    }
    bigint::assign_pow10(in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    bigint::operator<<=((bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                        in_stack_fffffffffffffc94);
  }
  uVar2 = (uint)((in_stack_00000008 & 1) == 0);
  if (local_2d0 == (undefined1 *)0x0) {
    local_2d0 = local_220;
  }
  bVar9 = local_8 < 0;
  if ((local_4 & 2) != 0) {
    in_stack_fffffffffffffcac =
         add_compare((bigint *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                     (bigint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     (bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    if ((int)(in_stack_fffffffffffffcac + uVar2) < 1) {
      *local_18 = *local_18 + -1;
      bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         CONCAT13(in_stack_fffffffffffffc6f,
                                  CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      if ((local_8 < 0) &&
         (bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70)
                             ,CONCAT13(in_stack_fffffffffffffc6f,
                                       CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)
                                      )), local_2d0 != local_220)) {
        bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           CONCAT13(in_stack_fffffffffffffc6f,
                                    CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      }
    }
    if ((local_4 & 4) != 0) {
      adjust_precision((int *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    }
  }
  if (bVar9) {
    local_8 = 0;
    pcVar7 = buffer<char>::data((buffer<char> *)local_10);
    while( true ) {
      iVar3 = bigint::divmod_assign
                        ((bigint *)
                         CONCAT44(in_stack_fffffffffffffc8c,
                                  CONCAT13(in_stack_fffffffffffffc8b,
                                           CONCAT12(in_stack_fffffffffffffc8a,
                                                    in_stack_fffffffffffffc88))),
                         in_stack_fffffffffffffc80);
      iVar6 = iVar3;
      iVar4 = compare((bigint *)
                      CONCAT44(in_stack_fffffffffffffc8c,
                               CONCAT13(in_stack_fffffffffffffc8b,
                                        CONCAT12(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88
                                                ))),in_stack_fffffffffffffc80);
      iVar5 = iVar4 - uVar2;
      in_stack_fffffffffffffca0 =
           add_compare((bigint *)CONCAT44(in_stack_fffffffffffffcac,iVar6),
                       (bigint *)CONCAT44(iVar4,in_stack_fffffffffffffca0),
                       (bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      bVar9 = 0 < (int)(in_stack_fffffffffffffca0 + uVar2);
      iVar8 = local_8 + 1;
      pcVar7[local_8] = (char)iVar3 + '0';
      if ((iVar5 < 0) || (bVar9)) break;
      local_8 = iVar8;
      bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         CONCAT13(in_stack_fffffffffffffc6f,
                                  CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                         CONCAT13(in_stack_fffffffffffffc6f,
                                  CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      if (local_2d0 != local_220) {
        bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           CONCAT13(in_stack_fffffffffffffc6f,
                                    CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      }
    }
    if (iVar5 < 0) {
      local_8 = iVar8;
      if ((bVar9) &&
         ((iVar6 = add_compare((bigint *)CONCAT44(in_stack_fffffffffffffcac,iVar6),
                               (bigint *)CONCAT44(iVar4,in_stack_fffffffffffffca0),
                               (bigint *)
                               CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)),
          0 < iVar6 || ((iVar6 == 0 && (iVar3 % 2 != 0)))))) {
        pcVar7[local_8 + -1] = pcVar7[local_8 + -1] + '\x01';
      }
    }
    else {
      pcVar7[local_8] = pcVar7[local_8] + '\x01';
      local_8 = iVar8;
    }
    to_unsigned<int>(0);
    buffer<char>::try_resize
              ((buffer<char> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               CONCAT17(in_stack_fffffffffffffc6f,
                        CONCAT16(in_stack_fffffffffffffc6e,
                                 CONCAT24(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))));
    *local_18 = *local_18 - (local_8 + -1);
  }
  else {
    *local_18 = *local_18 - (local_8 + -1);
    if (local_8 < 1) {
      if (local_8 == 0) {
        bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           CONCAT13(in_stack_fffffffffffffc6f,
                                    CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
        add_compare((bigint *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                    (bigint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                    (bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      }
      buffer<char>::push_back
                ((buffer<char> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 (char *)CONCAT17(in_stack_fffffffffffffc6f,
                                  CONCAT16(in_stack_fffffffffffffc6e,
                                           CONCAT24(in_stack_fffffffffffffc6c,
                                                    in_stack_fffffffffffffc68))));
    }
    else {
      divisor = local_10;
      to_unsigned<int>(0);
      buffer<char>::try_resize
                ((buffer<char> *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                 CONCAT17(in_stack_fffffffffffffc6f,
                          CONCAT16(in_stack_fffffffffffffc6e,
                                   CONCAT24(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68))));
      for (local_330 = 0; local_330 < local_8 + -1; local_330 = local_330 + 1) {
        iVar6 = bigint::divmod_assign
                          ((bigint *)
                           CONCAT44(in_stack_fffffffffffffc8c,
                                    CONCAT13(in_stack_fffffffffffffc8b,
                                             CONCAT12(in_stack_fffffffffffffc8a,
                                                      in_stack_fffffffffffffc88))),divisor);
        local_334 = (char)iVar6;
        local_334 = local_334 + '0';
        pcVar7 = buffer<char>::operator[]<int>((buffer<char> *)local_10,local_330);
        *pcVar7 = local_334;
        bigint::operator*=((bigint *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                           CONCAT13(in_stack_fffffffffffffc6f,
                                    CONCAT12(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc6c)));
      }
      local_338 = bigint::divmod_assign
                            ((bigint *)
                             CONCAT44(in_stack_fffffffffffffc8c,
                                      CONCAT13(in_stack_fffffffffffffc8b,
                                               CONCAT12(in_stack_fffffffffffffc8a,
                                                        in_stack_fffffffffffffc88))),divisor);
      iVar6 = local_338;
      iVar3 = add_compare((bigint *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                          (bigint *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          (bigint *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      if ((0 < iVar3) || ((iVar3 == 0 && (local_338 % 2 != 0)))) {
        if (local_338 == 9) {
          pcVar7 = buffer<char>::operator[]<int>((buffer<char> *)local_10,local_8 + -1);
          *pcVar7 = ':';
          iVar4 = local_8;
          while( true ) {
            local_344 = iVar4 + -1;
            uVar10 = false;
            if (0 < local_344) {
              pcVar7 = buffer<char>::operator[]<int>((buffer<char> *)local_10,local_344);
              uVar10 = *pcVar7 == ':';
            }
            if ((bool)uVar10 == false) break;
            pcVar7 = buffer<char>::operator[]<int>((buffer<char> *)local_10,local_344);
            *pcVar7 = '0';
            pcVar7 = buffer<char>::operator[]<int>((buffer<char> *)local_10,iVar4 + -2);
            *pcVar7 = *pcVar7 + '\x01';
            iVar4 = local_344;
          }
          pcVar7 = buffer<char>::operator[]<int>((buffer<char> *)local_10,0);
          if (*pcVar7 == ':') {
            pcVar7 = buffer<char>::operator[]<int>((buffer<char> *)local_10,0);
            *pcVar7 = '1';
            if ((local_4 & 4) == 0) {
              *local_18 = *local_18 + 1;
            }
            else {
              buffer<char>::push_back
                        ((buffer<char> *)CONCAT44(iVar6,iVar3),
                         (char *)CONCAT17(uVar10,CONCAT16(in_stack_fffffffffffffc6e,
                                                          CONCAT24(in_stack_fffffffffffffc6c,
                                                                   in_stack_fffffffffffffc68))));
            }
          }
          goto LAB_00448d7c;
        }
        local_338 = local_338 + 1;
      }
      cVar1 = (char)local_338 + '0';
      pcVar7 = buffer<char>::operator[]<int>((buffer<char> *)local_10,local_8 + -1);
      *pcVar7 = cVar1;
    }
  }
LAB_00448d7c:
  bigint::~bigint((bigint *)0x448d89);
  bigint::~bigint((bigint *)0x448d96);
  bigint::~bigint((bigint *)0x448da3);
  bigint::~bigint((bigint *)0x448db0);
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(basic_fp<uint128_t> value,
                                          unsigned flags, int num_digits,
                                          buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  bool is_predecessor_closer = (flags & dragon::predecessor_closer) != 0;
  int shift = is_predecessor_closer ? 2 : 1;
  if (value.e >= 0) {
    numerator = value.f;
    numerator <<= value.e + shift;
    lower = 1;
    lower <<= value.e;
    if (is_predecessor_closer) {
      upper_store = 1;
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (is_predecessor_closer) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= value.f;
    numerator <<= shift;
    denominator = 1;
    denominator <<= shift - value.e;
  } else {
    numerator = value.f;
    numerator <<= shift;
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower = 1;
    if (is_predecessor_closer) {
      upper_store = 1ULL << 1;
      upper = &upper_store;
    }
  }
  int even = static_cast<int>((value.f & 1) == 0);
  if (!upper) upper = &lower;
  bool shortest = num_digits < 0;
  if ((flags & dragon::fixup) != 0) {
    if (add_compare(numerator, *upper, denominator) + even <= 0) {
      --exp10;
      numerator *= 10;
      if (num_digits < 0) {
        lower *= 10;
        if (upper != &lower) *upper *= 10;
      }
    }
    if ((flags & dragon::fixed) != 0) adjust_precision(num_digits, exp10 + 1);
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (shortest) {
    // Generate the shortest representation.
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits <= 0) {
    auto digit = '0';
    if (num_digits == 0) {
      denominator *= 10;
      digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    }
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        if ((flags & dragon::fixed) != 0)
          buf.push_back('0');
        else
          ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}